

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODMultiUPCEANReader.cpp
# Opt level: O2

void __thiscall ZXing::OneD::PartialResult::PartialResult(PartialResult *this)

{
  (this->txt)._M_dataplus._M_p = (pointer)&(this->txt).field_2;
  (this->txt)._M_string_length = 0;
  (this->txt).field_2._M_local_buf[0] = '\0';
  (this->end)._data = (Iterator)0x0;
  (this->end)._size = 0;
  (this->end)._base = (Iterator)0x0;
  (this->end)._end = (Iterator)0x0;
  this->format = None;
  std::__cxx11::string::reserve((ulong)this);
  return;
}

Assistant:

PartialResult() { txt.reserve(14); }